

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

uint128_c_t weak_farmhash_cc_len_32_with_seeds(char *s,uint64_t a,uint64_t b)

{
  uint64_t a_00;
  uint64_t z;
  uint64_t y;
  uint64_t in_RDX;
  uint64_t in_RSI;
  char *in_RDI;
  uint128_c_t uVar1;
  uint64_t in_stack_ffffffffffffffb8;
  
  a_00 = fetch64(in_RDI);
  z = fetch64(in_RDI + 8);
  y = fetch64(in_RDI + 0x10);
  fetch64(in_RDI + 0x18);
  uVar1 = weak_farmhash_cc_len_32_with_seeds_vals(in_RSI,in_RDX,y,z,a_00,in_stack_ffffffffffffffb8);
  return uVar1;
}

Assistant:

static inline uint128_c_t weak_farmhash_cc_len_32_with_seeds(
    const char* s, uint64_t a, uint64_t b) {
  return weak_farmhash_cc_len_32_with_seeds_vals(fetch64(s),
                                fetch64(s + 8),
                                fetch64(s + 16),
                                fetch64(s + 24),
                                a,
                                b);
}